

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dg-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  reference pPVar2;
  ulong uVar3;
  DependenceGraph<dg::LLVMNode> *pDVar4;
  reference ppLVar5;
  SlicerStatistics *pSVar6;
  raw_ostream *prVar7;
  type pMVar8;
  char **in_RSI;
  uint in_EDI;
  LLVMDG2Dot dumper_1;
  LLVMDGDumpBlocks dumper;
  char *only_func;
  SlicerStatistics *st;
  raw_os_ostream output;
  ofstream ofs;
  string fl;
  LLVMNode *start;
  iterator __end3;
  iterator __begin3;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *__range3;
  uint32_t slid;
  LLVMSlicer slicer;
  char *sc [3];
  string *slicingCriteria;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> callsites;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> dg;
  LLVMDependenceGraphBuilder builder;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  PrintingOpts opt;
  iterator __end1;
  iterator __begin1;
  list<PrintingOpts,_bool,_llvm::cl::parser<PrintingOpts>_> *__range1;
  uint32_t opts;
  SlicerOptions options;
  ostream *in_stack_fffffffffffff1e8;
  SlicerOptions *in_stack_fffffffffffff1f0;
  string *in_stack_fffffffffffff1f8;
  raw_ostream *in_stack_fffffffffffff200;
  LLVMDependenceGraphBuilder *in_stack_fffffffffffff208;
  char *in_stack_fffffffffffff258;
  char *in_stack_fffffffffffff260;
  LLVMDG2Dot *in_stack_fffffffffffff268;
  uint32_t in_stack_fffffffffffff28c;
  LLVMNode *in_stack_fffffffffffff290;
  LLVMDependenceGraph *in_stack_fffffffffffff298;
  LLVMSlicer *in_stack_fffffffffffff2a0;
  LLVMDependenceGraphOptions *in_stack_fffffffffffff370;
  Module *in_stack_fffffffffffff378;
  LLVMDependenceGraphBuilder *in_stack_fffffffffffff380;
  undefined1 in_stack_fffffffffffff3c3;
  uint32_t in_stack_fffffffffffff3c4;
  LLVMNode *in_stack_fffffffffffff3c8;
  Slicer<dg::LLVMNode> *in_stack_fffffffffffff3d0;
  raw_ostream local_850 [72];
  undefined1 local_808 [512];
  string local_608 [32];
  LLVMNode *local_5e8;
  _Self local_5e0;
  _Self local_5d8;
  set *local_5d0;
  uint32_t local_5c4;
  Slicer<dg::LLVMNode> local_5c0;
  char *local_528;
  char *local_520;
  undefined8 local_518;
  undefined1 *local_508;
  set local_500 [580];
  undefined4 local_2bc;
  char local_2b8 [8];
  undefined1 local_2b0 [24];
  __normal_iterator<PrintingOpts_*,_std::vector<PrintingOpts,_std::allocator<PrintingOpts>_>_>
  local_298;
  list<PrintingOpts,_bool,_llvm::cl::parser<PrintingOpts>_> *local_290;
  uint local_284;
  undefined1 local_280 [464];
  undefined1 auStack_b0 [96];
  string asStack_50 [64];
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)local_280,(char **)(ulong)local_8,SUB81(local_10,0),false);
  local_284 = 0x155;
  local_290 = &print_opts;
  local_298._M_current =
       (PrintingOpts *)
       llvm::cl::list_storage<PrintingOpts,_bool>::begin
                 ((list_storage<PrintingOpts,_bool> *)in_stack_fffffffffffff1e8);
  local_2b0._16_8_ =
       llvm::cl::list_storage<PrintingOpts,_bool>::end
                 ((list_storage<PrintingOpts,_bool> *)in_stack_fffffffffffff1e8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<PrintingOpts_*,_std::vector<PrintingOpts,_std::allocator<PrintingOpts>_>_>
                             *)in_stack_fffffffffffff1f0,
                            (__normal_iterator<PrintingOpts_*,_std::vector<PrintingOpts,_std::allocator<PrintingOpts>_>_>
                             *)in_stack_fffffffffffff1e8), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<PrintingOpts_*,_std::vector<PrintingOpts,_std::allocator<PrintingOpts>_>_>
             ::operator*(&local_298);
    local_2b0._12_4_ = *pPVar2;
    in_stack_fffffffffffff1f8 = (string *)(ulong)(uint)local_2b0._12_4_;
    switch(in_stack_fffffffffffff1f8) {
    case (string *)0x0:
      local_284 = local_284 | 0x400;
      break;
    case (string *)0x1:
      local_284 = local_284 | 3;
      break;
    case (string *)0x2:
      local_284 = local_284 | 0x800;
      break;
    case (string *)0x3:
      local_284 = local_284 & 0xfffffffe;
      break;
    case (string *)0x4:
      local_284 = local_284 & 0xffffffbf;
      break;
    case (string *)0x5:
      local_284 = local_284 & 0xfffffffb;
      break;
    case (string *)0x6:
      local_284 = local_284 & 0xffffffef;
    }
    __gnu_cxx::
    __normal_iterator<PrintingOpts_*,_std::vector<PrintingOpts,_std::allocator<PrintingOpts>_>_>::
    operator++(&local_298);
  }
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x189296);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_2b0);
  parseModule(local_2b8,(LLVMContext *)"llvm-dg-dump",(SlicerOptions *)local_2b0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1892dc);
  if (bVar1) {
    std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
              ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x189308);
    ::dg::llvmdg::LLVMDependenceGraphBuilder::LLVMDependenceGraphBuilder
              (in_stack_fffffffffffff380,in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    ::dg::llvmdg::LLVMDependenceGraphBuilder::build(in_stack_fffffffffffff208);
    std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
    unique_ptr((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *
               )in_stack_fffffffffffff1f0,
               (unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *
               )in_stack_fffffffffffff1e8);
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x18934a);
    local_508 = auStack_b0;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_528 = (char *)std::__cxx11::string::c_str();
      local_520 = "klee_assume";
      local_518 = 0;
      std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
      operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                  *)0x1893b2);
      ::dg::LLVMDependenceGraph::getCallSites(&local_528,local_500);
      ::dg::llvmdg::LLVMSlicer::LLVMSlicer((LLVMSlicer *)in_stack_fffffffffffff1f0);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff1f0,(char *)in_stack_fffffffffffff1e8);
      if (bVar1) {
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x189404);
        if (bVar1) {
          pDVar4 = (DependenceGraph<dg::LLVMNode> *)
                   std::
                   unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                   ::operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                                 *)0x189417);
          ::dg::DependenceGraph<dg::LLVMNode>::getExit(pDVar4);
          ::dg::Slicer<dg::LLVMNode>::mark
                    (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c4,
                     (bool)in_stack_fffffffffffff3c3);
        }
        else {
          in_stack_fffffffffffff1f0 =
               (SlicerOptions *)
               std::
               unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
               get((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                    *)0x189442);
          pDVar4 = (DependenceGraph<dg::LLVMNode> *)
                   std::
                   unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                   ::operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                                 *)0x189454);
          ::dg::DependenceGraph<dg::LLVMNode>::getExit(pDVar4);
          ::dg::llvmdg::LLVMSlicer::slice
                    (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                     in_stack_fffffffffffff28c);
        }
      }
      else {
        bVar1 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                ::empty((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                         *)0x189485);
        if (bVar1) {
          llvm::errs();
          llvm::raw_ostream::operator<<(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8)
          ;
          llvm::raw_ostream::operator<<(in_stack_fffffffffffff200,in_stack_fffffffffffff1f8);
          llvm::raw_ostream::operator<<(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8)
          ;
          exit(1);
        }
        local_5c4 = 0;
        local_5d0 = local_500;
        local_5d8._M_node =
             (_Base_ptr)
             std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
             begin((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                    *)in_stack_fffffffffffff1e8);
        local_5e0._M_node =
             (_Base_ptr)
             std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
             end((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 in_stack_fffffffffffff1e8);
        while (bVar1 = std::operator!=(&local_5d8,&local_5e0), bVar1) {
          ppLVar5 = std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                              ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x189535);
          local_5e8 = *ppLVar5;
          local_5c4 = ::dg::Slicer<dg::LLVMNode>::mark
                                (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8,
                                 in_stack_fffffffffffff3c4,(bool)in_stack_fffffffffffff3c3);
          std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++
                    ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)in_stack_fffffffffffff1f0);
        }
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x189587);
        if (!bVar1) {
          std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
          get((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
              0x189598);
          ::dg::llvmdg::LLVMSlicer::slice
                    (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                     in_stack_fffffffffffff28c);
        }
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x1895c8);
      if (!bVar1) {
        std::__cxx11::string::string(local_608,asStack_50);
        std::__cxx11::string::append((char *)local_608);
        std::ofstream::ofstream(local_808,local_608,0x10);
        llvm::raw_os_ostream::raw_os_ostream
                  ((raw_os_ostream *)in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
        pSVar6 = ::dg::Slicer<dg::LLVMNode>::getStatistics(&local_5c0);
        llvm::errs();
        prVar7 = llvm::raw_ostream::operator<<
                           (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
        llvm::raw_ostream::operator<<(prVar7,pSVar6->nodesRemoved);
        prVar7 = llvm::raw_ostream::operator<<
                           (in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
        llvm::raw_ostream::operator<<(prVar7,pSVar6->nodesTotal);
        llvm::raw_ostream::operator<<(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
        pMVar8 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                           ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                            in_stack_fffffffffffff1f0);
        llvm::WriteBitcodeToFile
                  (pMVar8,local_850,false,(ModuleSummaryIndex *)0x0,false,(array *)0x0);
        llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)local_850);
        std::ofstream::~ofstream(local_808);
        std::__cxx11::string::~string(local_608);
      }
      ::dg::llvmdg::LLVMSlicer::~LLVMSlicer((LLVMSlicer *)in_stack_fffffffffffff1f0);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::c_str();
    }
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x18974d);
    if (bVar1) {
      std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::get
                ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                  *)0x189760);
      ::dg::debug::LLVMDGDumpBlocks::LLVMDGDumpBlocks
                ((LLVMDGDumpBlocks *)in_stack_fffffffffffff200,
                 (LLVMDependenceGraph *)in_stack_fffffffffffff1f8,
                 (uint32_t)((ulong)in_stack_fffffffffffff1f0 >> 0x20),
                 (char *)in_stack_fffffffffffff1e8);
      ::dg::debug::LLVMDGDumpBlocks::dump
                ((LLVMDGDumpBlocks *)in_stack_fffffffffffff268,in_stack_fffffffffffff260,
                 in_stack_fffffffffffff258);
      ::dg::debug::LLVMDGDumpBlocks::~LLVMDGDumpBlocks((LLVMDGDumpBlocks *)0x1897a1);
    }
    else {
      std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::get
                ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                  *)0x1897b0);
      ::dg::debug::LLVMDG2Dot::LLVMDG2Dot
                ((LLVMDG2Dot *)in_stack_fffffffffffff200,
                 (LLVMDependenceGraph *)in_stack_fffffffffffff1f8,
                 (uint32_t)((ulong)in_stack_fffffffffffff1f0 >> 0x20),
                 (char *)in_stack_fffffffffffff1e8);
      ::dg::debug::LLVMDG2Dot::dump
                (in_stack_fffffffffffff268,in_stack_fffffffffffff260,in_stack_fffffffffffff258);
      ::dg::debug::LLVMDG2Dot::~LLVMDG2Dot((LLVMDG2Dot *)0x1897e8);
    }
    local_4 = 0;
    local_2bc = 1;
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::~set
              ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
               0x18980b);
    std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
    ~unique_ptr((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                 *)in_stack_fffffffffffff1f0);
    ::dg::llvmdg::LLVMDependenceGraphBuilder::~LLVMDependenceGraphBuilder
              ((LLVMDependenceGraphBuilder *)in_stack_fffffffffffff1f0);
  }
  else {
    local_4 = 1;
    local_2bc = 1;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffff1f0);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_2b0);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffff1f0);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    uint32_t opts = PRINT_CFG | PRINT_DD | PRINT_CD | PRINT_USE | PRINT_ID;
    for (auto opt : print_opts) {
        switch (opt) {
        case no_control:
            opts &= ~PRINT_CD;
            break;
        case no_use:
            opts &= ~PRINT_USE;
            break;
        case no_data:
            opts &= ~PRINT_DD;
            break;
        case no_cfg:
            opts &= ~PRINT_CFG;
            break;
        case call:
            opts |= PRINT_CALL;
            break;
        case postdom:
            opts |= PRINT_POSTDOM;
            break;
        case cfgall:
            opts |= PRINT_CFG | PRINT_REV_CFG;
            break;
        }
    }

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-dg-dump", context, options);
    if (!M)
        return 1;

    llvmdg::LLVMDependenceGraphBuilder builder(M.get(), options.dgOptions);
    auto dg = builder.build();

    std::set<LLVMNode *> callsites;
    const std::string &slicingCriteria = options.slicingCriteria;
    if (!slicingCriteria.empty()) {
        const char *sc[] = {slicingCriteria.c_str(), "klee_assume", nullptr};

        dg->getCallSites(sc, &callsites);

        llvmdg::LLVMSlicer slicer;

        if (slicingCriteria == "ret") {
            if (mark_only)
                slicer.mark(dg->getExit());
            else
                slicer.slice(dg.get(), dg->getExit());
        } else {
            if (callsites.empty()) {
                errs() << "ERR: slicing criterion not found: "
                       << slicingCriteria << "\n";
                exit(1);
            }

            uint32_t slid = 0;
            for (LLVMNode *start : callsites)
                slid = slicer.mark(start, slid);

            if (!mark_only)
                slicer.slice(dg.get(), nullptr, slid);
        }

        if (!mark_only) {
            std::string fl(options.inputFile);
            fl.append(".sliced");
            std::ofstream ofs(fl);
            llvm::raw_os_ostream output(ofs);

            SlicerStatistics &st = slicer.getStatistics();
            errs() << "INFO: Sliced away " << st.nodesRemoved << " from "
                   << st.nodesTotal << " nodes\n";

#if LLVM_VERSION_MAJOR > 6
            llvm::WriteBitcodeToFile(*M, output);
#else
            llvm::WriteBitcodeToFile(M.get(), output);
#endif
        }
    }
    const char *only_func = nullptr;
    if (!dump_func_only.empty())
        only_func = dump_func_only.c_str();

    if (bb_only) {
        LLVMDGDumpBlocks dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    } else {
        LLVMDG2Dot dumper(dg.get(), opts);
        dumper.dump(nullptr, only_func);
    }

    return 0;
}